

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall xla::GraphCycles::CheckInvariants(GraphCycles *this)

{
  int iVar1;
  Rep *pRVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer pNVar5;
  int *piVar6;
  ostream *poVar7;
  ulong uVar8;
  __ireturn_type _Var9;
  NodeSet ranks;
  
  pRVar2 = this->rep_;
  ranks._M_h._M_buckets = &ranks._M_h._M_single_bucket;
  ranks._M_h._M_bucket_count = 1;
  ranks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ranks._M_h._M_element_count = 0;
  ranks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ranks._M_h._M_rehash_policy._M_next_resize = 0;
  ranks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar8 = 0;
  while( true ) {
    pNVar3 = (pRVar2->nodes_).
             super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pRVar2->nodes_).
                      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3 >> 3) <= uVar8) {
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&ranks._M_h);
      return true;
    }
    if (pNVar3[uVar8].visited == true) break;
    pNVar3 = pNVar3 + uVar8;
    _Var9 = std::__detail::
            _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&ranks,&pNVar3->rank);
    if (((undefined1  [16])_Var9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Duplicate occurrence of rank ");
      std::ostream::operator<<(poVar7,pNVar3->rank);
      goto LAB_001822ee;
    }
    pNVar4 = (pRVar2->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = *(int **)&pNVar4[uVar8].out.value_sequence_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    while (piVar6 != *(pointer *)
                      ((long)&pNVar4[uVar8].out.value_sequence_.
                              super__Vector_base<int,_std::allocator<int>_> + 8)) {
      iVar1 = *piVar6;
      pNVar5 = (pRVar2->nodes_).
               super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar6 = piVar6 + 1;
      if (pNVar5[iVar1].rank <= pNVar3->rank) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Edge ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,"->");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
        poVar7 = std::operator<<(poVar7," has bad rank assignment ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pNVar3->rank);
        poVar7 = std::operator<<(poVar7,"->");
        std::ostream::operator<<(poVar7,pNVar5[iVar1].rank);
        goto LAB_001822ee;
      }
    }
    uVar8 = uVar8 + 1;
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"Did not clear visited marker on node ");
  std::ostream::operator<<(poVar7,uVar8);
LAB_001822ee:
  exit(1);
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (size_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = &r->nodes_[x];
    if (nx->visited) {
      // LOG(FATAL) << "Did not clear visited marker on node " << x;
      std::cerr << "Did not clear visited marker on node " << x;
      std::exit(EXIT_FAILURE);  
    }
    if (!ranks.insert(nx->rank).second) {
      // LOG(FATAL) << "Duplicate occurrence of rank " << nx->rank;
      std::cerr  << "Duplicate occurrence of rank " << nx->rank;
      std::exit(EXIT_FAILURE);
    }
    NodeIO* nx_io = &r->node_io_[x];
    for (int32_t y : nx_io->out.GetSequence()) {
      Node* ny = &r->nodes_[y];
      if (nx->rank >= ny->rank) {
        /* LOG(FATAL) << "Edge " << x << "->" << y << " has bad rank assignment "
                   << nx->rank << "->" << ny->rank; */

        std::cerr << "Edge " << x << "->" << y << " has bad rank assignment "
                  << nx->rank << "->" << ny->rank;
        std::exit(EXIT_FAILURE);
      }
    }
  }
  return true;
}